

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpkview.c
# Opt level: O3

_Bool XPKView_MainLoop(void)

{
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int win_h;
  int win_w;
  SDL_Rect dstrect;
  SDL_Event event;
  int local_84;
  int local_80;
  uint local_7c;
  int local_78;
  int local_74;
  undefined8 local_70;
  int local_68 [5];
  int local_54;
  
  SDL_GetWindowSize(app.window,&local_80,&local_84);
  do {
    iVar2 = SDL_PollEvent(local_68);
    uVar6 = 0;
    while (iVar2 != 0) {
      if (local_68[0] == 0x100) {
LAB_00102abd:
        uVar6 = 1;
      }
      else if (local_68[0] == 0x300) {
        if (local_54 < 0x71) {
          if (local_54 == 0x62) {
            app.checkerboard_on = (_Bool)(app.checkerboard_on ^ 1);
          }
          else if (local_54 == 99) {
            XPKView_ToggleCentered();
          }
          goto LAB_00102b00;
        }
        if (local_54 == 0x71) goto LAB_00102abd;
        if (local_54 == 0x4000004f) {
          if (app.which_entry < (int)((app.xpk)->n_entries - 1)) {
            app.which_entry = app.which_entry + 1;
            goto LAB_00102aec;
          }
        }
        else if ((local_54 == 0x40000050) && (0 < app.which_entry)) {
          app.which_entry = app.which_entry + -1;
LAB_00102aec:
          XPKView_LoadXPKEntry();
        }
LAB_00102b00:
        uVar6 = 0;
      }
      iVar2 = SDL_PollEvent(local_68);
    }
    local_7c = uVar6;
    SDL_SetRenderDrawColor(app.renderer,0,0,0,0);
    SDL_RenderClear(app.renderer);
    if ((app.checkerboard_on == true) && (0x1f < local_84)) {
      iVar8 = 0;
      iVar2 = local_84;
      iVar3 = local_80;
      do {
        if (0x1f < iVar3) {
          iVar5 = 0;
          iVar7 = 0;
          do {
            local_70 = 0x2000000020;
            local_78 = iVar5;
            local_74 = iVar8 << 5;
            SDL_RenderCopy(app.renderer,app.checkerboard_tx,0,&local_78);
            iVar7 = iVar7 + 1;
            iVar4 = local_80 + 0x1f;
            if (-1 < local_80) {
              iVar4 = local_80;
            }
            iVar5 = iVar5 + 0x20;
            iVar2 = local_84;
            iVar3 = local_80;
          } while (iVar7 < iVar4 >> 5);
        }
        iVar8 = iVar8 + 1;
        iVar5 = iVar2 + 0x1f;
        if (-1 < iVar2) {
          iVar5 = iVar2;
        }
      } while (iVar8 < iVar5 >> 5);
    }
    SDL_RenderCopy(app.renderer,app.xpkentry_tx,0);
    SDL_RenderPresent(app.renderer);
    uVar1 = SDL_Delay(1);
    if ((local_7c & 1) != 0) {
      return (_Bool)uVar1;
    }
  } while( true );
}

Assistant:

static bool
XPKView_MainLoop(void)
{
	bool done = false;
	bool want_quit = false;
	SDL_Event event;

	int win_w, win_h;
	SDL_GetWindowSize(app.window, &win_w, &win_h);

	while (!done) {
		while (SDL_PollEvent(&event)) {
			switch (event.type) {
			case SDL_KEYDOWN:
				want_quit = XPKView_HandleKeyboard(event.key.keysym.sym);
				break;
			case SDL_QUIT:
				want_quit = true;
				break;
			default:
				; /* OK */
			}
		}

		if (want_quit) {
			done = true;
		}

		/* Now we can draw stuff. */
		SDL_SetRenderDrawColor(app.renderer, 0, 0, 0, 0);
		SDL_RenderClear(app.renderer);

		if (app.checkerboard_on) {
			for (int i = 0; i < win_h/32; i++) {
				for (int j = 0; j < win_w/32; j++) {
					SDL_Rect dstrect = (SDL_Rect){32*j, 32*i, 32, 32};
					SDL_RenderCopy(app.renderer, app.checkerboard_tx, NULL, &dstrect);
				}
			}
		}

		SDL_RenderCopy(app.renderer, app.xpkentry_tx, NULL, &app.entry_rect);

		SDL_RenderPresent(app.renderer);

		/* LOVE2D does this. It can dramatically reduce CPU usage. */
		SDL_Delay(1);
	}

	return true;
}